

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitGlobalSet
          (Flow *__return_storage_ptr__,
          ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *this,GlobalSet *curr)

{
  Module *this_00;
  size_t sVar1;
  char *pcVar2;
  Global *pGVar3;
  undefined1 local_70 [8];
  Flow setFlow;
  
  if ((((this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>).field_0x1c & 1) == 0) &&
     (this_00 = (this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>).module,
     this_00 != (Module *)0x0)) {
    pGVar3 = Module::getGlobal(this_00,(Name)(curr->name).super_IString.str);
    if (pGVar3->mutable_ == false) {
      __assert_fail("this->module->getGlobal(curr->name)->mutable_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x849,
                    "Flow wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitGlobalSet(GlobalSet *) [SubType = wasm::PrecomputingExpressionRunner]"
                   );
    }
    ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
              ((Flow *)local_70,&this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>,
               curr->value);
    if (setFlow.breakTo.super_IString.str._M_len == 0) {
      setGlobalValue(this,(Name)(curr->name).super_IString.str,(Literals *)local_70);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &setFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&setFlow);
      return __return_storage_ptr__;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &setFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&setFlow);
  }
  pcVar2 = DAT_00da7e30;
  sVar1 = NONCONSTANT_FLOW;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalSet(GlobalSet* curr) {
    NOTE_ENTER("GlobalSet");
    NOTE_NAME(curr->name);
    if (!(flags & FlagValues::PRESERVE_SIDEEFFECTS) &&
        this->module != nullptr) {
      // If we are evaluating and not replacing the expression, remember the
      // constant value set, if any, for subsequent gets.
      assert(this->module->getGlobal(curr->name)->mutable_);
      auto setFlow = ExpressionRunner<SubType>::visit(curr->value);
      if (!setFlow.breaking()) {
        setGlobalValue(curr->name, setFlow.values);
        return Flow();
      }
    }
    return Flow(NONCONSTANT_FLOW);
  }